

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzautopointer.h
# Opt level: O0

void __thiscall
TPZAutoPointer<TPZDohrAssembleItem<float>_>::TPZReference::TPZReference
          (TPZReference *this,TPZDohrAssembleItem<float> *pointer)

{
  undefined8 in_RSI;
  undefined8 *in_RDI;
  memory_order __b;
  atomic<int> *this_00;
  
  *in_RDI = 0;
  this_00 = (atomic<int> *)(in_RDI + 1);
  std::atomic<int>::atomic(this_00,(__integral_type)((ulong)in_RDI >> 0x20));
  *in_RDI = in_RSI;
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  LOCK();
  (this_00->super___atomic_base<int>)._M_i = 1;
  UNLOCK();
  return;
}

Assistant:

TPZReference(T *pointer)
        {
            fPointer = pointer;
            fCounter.store(1);
        }